

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

char * helicsFederateGetTag(HelicsFederate fed,char *tagName,HelicsError *err)

{
  Federate *this;
  size_t sVar1;
  string *psVar2;
  char *pcVar3;
  string_view tag;
  
  this = getFed(fed,err);
  pcVar3 = "";
  if (this != (Federate *)0x0) {
    if (tagName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Tag name cannot be null";
      }
    }
    else {
      sVar1 = strlen(tagName);
      tag._M_str = tagName;
      tag._M_len = sVar1;
      psVar2 = helics::Federate::getTag_abi_cxx11_(this,tag);
      pcVar3 = (psVar2->_M_dataplus)._M_p;
    }
  }
  return pcVar3;
}

Assistant:

const char* helicsFederateGetTag(HelicsFederate fed, const char* tagName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullcstr;
    }
    if (tagName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidTagString);
        return nullcstr;
    }
    try {
        const auto& str = fedObj->getTag(tagName);
        return str.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullcstr;
    }
    // LCOV_EXCL_STOP
}